

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O0

string * GetTestPath_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  allocator<char> local_1019;
  char local_1018 [8];
  char path [4096];
  
  bVar1 = GetUniquePathFromEnv("GPROF_TEST_PATH",local_1018);
  if (!bVar1) {
    syscall(1,2,"Check failed: GetUniquePathFromEnv(TEST_VAR, path)\n",0x33);
    abort();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,local_1018,&local_1019);
  std::allocator<char>::~allocator(&local_1019);
  return in_RDI;
}

Assistant:

std::string GetTestPath() {
  char path[PATH_MAX];
  CHECK(GetUniquePathFromEnv(TEST_VAR, path));
  return path;
}